

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Local.cpp
# Opt level: O1

Point Local::moves_fast_match
                (set<Point,_std::less<Point>,_std::allocator<Point>_> *options,char input,
                bool *reselect,bool get)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  iterator iVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  int iVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  bool bVar12;
  set<Point,_std::less<Point>,_std::allocator<Point>_> matches;
  set<Point,_std::less<Point>,_std::allocator<Point>_> final_matches;
  Point local_b8;
  int local_b4;
  _Alloc_node local_b0;
  uint local_a8;
  int local_a4;
  bool *local_a0;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_98;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *local_68;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_60;
  
  *reselect = false;
  local_a0 = reselect;
  if ((options->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) {
    local_98._M_impl._0_1_ =
         (char)(options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color + 0x61;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_98,1);
    plVar6 = (long *)std::ostream::operator<<
                               (poVar5,(short)*(undefined2 *)
                                               ((long)&(options->_M_t)._M_impl.super__Rb_tree_header
                                                       ._M_header._M_left[1]._M_color + 2) + 1);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    local_b8 = (Point)(options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  }
  else {
    uVar11 = CONCAT71(in_register_00000031,input) & 0xffffffff;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(options->_M_t)._M_impl.super__Rb_tree_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68 = options;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      do {
        if ((get & 1U) != 0) {
          cVar2 = getch();
          uVar3 = tolower((int)cVar2);
          uVar11 = (ulong)uVar3;
        }
        iVar10 = (int)(char)uVar11;
        iVar4 = isspace(iVar10);
        get = true;
      } while (iVar4 != 0);
      if ((char)uVar11 == 'u') {
        local_b0._M_t._0_1_ = 0x75;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_b0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        *local_a0 = true;
        Point::Point(&local_b8,-1,-1);
        goto LAB_0010edc1;
      }
      local_a8 = (uint)uVar11;
      p_Var9 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        local_b4 = iVar10 + -0x31;
        local_a4 = iVar10 + -0x61;
        cVar8._M_node = &local_98._M_impl.super__Rb_tree_header._M_header;
        do {
          if ((iVar10 - 0x30U < 10) &&
             (local_b4 == (short)*(undefined2 *)((long)&p_Var9[1]._M_color + 2))) {
LAB_0010eb37:
            local_b0._M_t = &local_98;
            iVar7 = std::
                    _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                    ::
                    _M_insert_unique_<Point_const&,std::_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>::_Alloc_node>
                              ((_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                                *)local_b0._M_t,cVar8,(Point *)(p_Var9 + 1),&local_b0);
            cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
          }
          else {
            iVar4 = isalpha(iVar10);
            if ((iVar4 != 0) && (local_a4 == (short)p_Var9[1]._M_color)) goto LAB_0010eb37;
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      uVar3 = local_a8;
      uVar11 = (ulong)local_a8;
      get = true;
      options = local_68;
    } while (local_98._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_b4 = isalpha(iVar10);
    local_b0._M_t._0_1_ = (char)uVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_b0,1);
    if (local_98._M_impl.super__Rb_tree_header._M_node_count == 1) {
      iVar4 = isalpha(iVar10);
      cVar2 = '1';
      if (iVar4 == 0) {
        cVar2 = 'a';
      }
      local_b0._M_t._0_1_ =
           cVar2 + *(char *)((long)&local_98._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                    _M_color + (ulong)(iVar4 != 0) * 2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_b0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      p_Var9 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      do {
        std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
        ::clear(&local_60);
        do {
          cVar2 = getch();
          uVar3 = tolower((int)cVar2);
          cVar2 = (char)uVar3;
          iVar4 = isspace((int)cVar2);
        } while (iVar4 != 0);
        if ((uVar3 & 0xff) == 0x75) {
          local_b0._M_t._0_1_ = 0x75;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_b0,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          *local_a0 = true;
          Point::Point(&local_b8,-1,-1);
          goto LAB_0010edc1;
        }
        if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_98._M_impl.super__Rb_tree_header) {
          bVar12 = local_b4 != 0;
          iVar4 = (int)cVar2;
          local_a4 = iVar4 + -0x31;
          local_a8 = iVar4 - 0x61;
          cVar8._M_node = &local_60._M_impl.super__Rb_tree_header._M_header;
          p_Var9 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if ((iVar4 - 0x30U < 10 && bVar12) &&
               (local_a4 == (short)*(undefined2 *)((long)&p_Var9[1]._M_color + 2))) {
LAB_0010eccc:
              local_b0._M_t = &local_60;
              iVar7 = std::
                      _Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                      ::
                      _M_insert_unique_<Point_const&,std::_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>::_Alloc_node>
                                ((_Rb_tree<Point,Point,std::_Identity<Point>,std::less<Point>,std::allocator<Point>>
                                  *)local_b0._M_t,cVar8,(Point *)(p_Var9 + 1),&local_b0);
              cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
            }
            else {
              iVar10 = isalpha(iVar4);
              if ((iVar10 != 0) && ((local_b4 == 0 && (local_a8 == (int)(short)p_Var9[1]._M_color)))
                 ) goto LAB_0010eccc;
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != &local_98._M_impl.super__Rb_tree_header);
        }
      } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 1);
      local_b0._M_t._0_1_ = cVar2;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_b0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    local_b8 = (Point)p_Var9[1]._M_color;
LAB_0010edc1:
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&local_60);
    std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
    ~_Rb_tree(&local_98);
  }
  return local_b8;
}

Assistant:

Point Local::moves_fast_match(const set<Point> &options, char input, bool &reselect, bool get) {
    reselect = false;
#if AUTOFILL
    // Only one option.
    if (options.size() == 1) {
        cout << (char) (options.begin()->get_x() + 'a') << options.begin()->get_y() + 1 << endl;
        return *options.begin();
    }
#endif // AUTOFILL

    set<Point> matches, final_matches;

    // First reduction.
    do {
        do {
            if (get) {
                input = (char) tolower(getch());
            }
            get = true;
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(options.begin(), options.end(), inserter(matches, matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (point.get_x() == input - 'a')));
                });
    } while (matches.empty());

    const bool first_char = isalpha(input);
    cout << input;

#if AUTOFILL
    // Only one option left.
    if (matches.size() == 1) {
        cout << (char) (isalpha(input) ? (char) matches.begin()->get_y() + '0' + 1 :
                        (char) matches.begin()->get_x() + 'a') << endl;
        return *matches.begin();
    }
#endif // AUTOFILL

    // Second reduction.
    do {
        final_matches.clear();

        do {
            input = (char) tolower(getch());
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(matches.begin(), matches.end(), inserter(final_matches, final_matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (first_char) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (!first_char) && (point.get_x() == input - 'a')));
                });
    } while (final_matches.size() != 1);

    cout << input << endl;

    // Final match.
    return *final_matches.begin();
}